

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOCallback.cpp
# Opt level: O2

void __thiscall libebml::IOCallback::readFully(IOCallback *this,void *Buffer,size_t Size)

{
  uint uVar1;
  ostream *poVar2;
  runtime_error *this_00;
  string local_1c0 [32];
  stringstream Msg;
  ostream local_190 [376];
  
  if (Buffer == (void *)0x0) {
    __cxa_rethrow();
  }
  else {
    uVar1 = (*this->_vptr_IOCallback[2])();
    if (uVar1 == Size) {
      return;
    }
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&Msg);
  poVar2 = std::operator<<(local_190,"EOF in readFully(");
  poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
  poVar2 = std::operator<<(poVar2,",");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,")");
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,local_1c0);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void IOCallback::readFully(void*Buffer,size_t Size)
{
  if(Buffer == NULL)
    throw;

  if(read(Buffer,Size) != Size) {
#if !defined(__GNUC__) || (__GNUC__ > 2)
    stringstream Msg;
    Msg<<"EOF in readFully("<<Buffer<<","<<Size<<")";
    throw runtime_error(Msg.str());
#endif // GCC2
  }
}